

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O0

Vector<float,_4> __thiscall
deqp::gles3::Functional::randomVector<4>
          (Functional *this,Random *rnd,Vector<float,_4> *minVal,Vector<float,_4> *maxVal)

{
  float *pfVar1;
  float fVar2;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  ulong in_XMM1_Qa;
  Vector<float,_4> VVar4;
  undefined4 local_2c;
  int ndx;
  Vector<float,_4> *maxVal_local;
  Vector<float,_4> *minVal_local;
  Random *rnd_local;
  Vector<float,_4> *res;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    pfVar1 = tcu::Vector<float,_4>::operator[](minVal,local_2c);
    fVar2 = *pfVar1;
    pfVar1 = tcu::Vector<float,_4>::operator[](maxVal,local_2c);
    in_XMM1_Qa = (ulong)(uint)*pfVar1;
    fVar2 = de::Random::getFloat(rnd,fVar2,*pfVar1);
    pfVar1 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_2c);
    uVar3 = (ulong)(uint)fVar2;
    *pfVar1 = fVar2;
  }
  VVar4.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar4.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  VVar4.m_data[0] = (float)(int)uVar3;
  VVar4.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector<float,_4>)VVar4.m_data;
}

Assistant:

static tcu::Vector<float, Size> randomVector (de::Random& rnd, const tcu::Vector<float, Size>& minVal = tcu::Vector<float, Size>(0.0f), const tcu::Vector<float, Size>& maxVal = tcu::Vector<float, Size>(1.0f))
{
	tcu::Vector<float, Size> res;
	for (int ndx = 0; ndx < Size; ndx++)
		res[ndx] = rnd.getFloat(minVal[ndx], maxVal[ndx]);
	return res;
}